

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location)

{
  bool bVar1;
  string *psVar2;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar1 = Consume(this,"service");
  if (bVar1) {
    LocationRecorder::Init(&LStack_38,service_location);
    LocationRecorder::AddPath(&LStack_38,1);
    LocationRecorder::RecordLegacyLocation(&LStack_38,&service->super_Message,NAME);
    *(byte *)service->_has_bits_ = (byte)service->_has_bits_[0] | 1;
    if (service->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar2 = (string *)operator_new(0x20);
      (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
      psVar2->_M_string_length = 0;
      (psVar2->field_2)._M_local_buf[0] = '\0';
      service->name_ = psVar2;
    }
    bVar1 = ConsumeIdentifier(this,service->name_,"Expected service name.");
    LocationRecorder::~LocationRecorder(&LStack_38);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceDefinition(ServiceDescriptorProto* service,
                                    const LocationRecorder& service_location) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        service, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location));
  return true;
}